

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv_run(uv_loop_t *loop,uv_run_mode mode)

{
  void **ppvVar1;
  uint *puVar2;
  uint uVar3;
  uv_handle_type uVar4;
  long ****pppplVar5;
  long ***ppplVar6;
  uv_stream_t *puVar7;
  void *pvVar8;
  int iVar9;
  ulong uVar10;
  uv_stream_t *stream;
  QUEUE *q;
  long ***local_48;
  long *local_40;
  ulong local_38;
  
  uVar10 = (ulong)mode;
  iVar9 = uv__loop_alive(loop);
  if (iVar9 == 0) {
    uv__update_time(loop);
    iVar9 = 0;
  }
  else {
    ppvVar1 = loop->pending_queue;
    local_38 = uVar10;
    while (loop->stop_flag == 0) {
      uv__update_time(loop);
      uv__run_timers(loop);
      pppplVar5 = (long ****)loop->pending_queue[0];
      if ((long ****)ppvVar1 != pppplVar5) {
        local_40 = (long *)loop->pending_queue[1];
        *local_40 = (long)&local_48;
        ppplVar6 = pppplVar5[1];
        loop->pending_queue[1] = ppplVar6;
        *ppplVar6 = (long **)ppvVar1;
        pppplVar5[1] = (long ***)&local_48;
        local_48 = (long ***)pppplVar5;
        while (&local_48 != (long ****)local_48) {
          ppplVar6 = (long ***)*local_48;
          *local_48[1] = (long *)ppplVar6;
          ppplVar6[1] = local_48[1];
          *local_48 = (long **)local_48;
          local_48[1] = (long **)local_48;
          (*(code *)local_48[-1])(loop,local_48 + -1,4);
        }
      }
      uv__run_idle(loop);
      uv__run_prepare(loop);
      if (((int)uVar10 == 0) || (iVar9 = 0, (int)uVar10 == 1 && (long ****)ppvVar1 == pppplVar5)) {
        iVar9 = uv_backend_timeout(loop);
      }
      uv__io_poll(loop,iVar9);
      uv__run_check(loop);
      puVar7 = (uv_stream_t *)loop->closing_handles;
      loop->closing_handles = (uv_handle_t *)0x0;
      while (stream = puVar7, uVar10 = local_38, stream != (uv_stream_t *)0x0) {
        uVar3 = stream->flags;
        if ((uVar3 & 1) == 0) {
          __assert_fail("handle->flags & UV_HANDLE_CLOSING",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                        ,0xfd,"void uv__finish_close(uv_handle_t *)");
        }
        if ((uVar3 & 2) != 0) {
          __assert_fail("!(handle->flags & UV_HANDLE_CLOSED)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                        ,0xfe,"void uv__finish_close(uv_handle_t *)");
        }
        puVar7 = (uv_stream_t *)stream->next_closing;
        stream->flags = uVar3 | 2;
        uVar4 = stream->type;
        if (UV_SIGNAL < uVar4) {
LAB_0043e718:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Utilities/cmlibuv/src/unix/core.c"
                        ,0x119,"void uv__finish_close(uv_handle_t *)");
        }
        if ((0x1275eU >> (uVar4 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
          if ((0x5080U >> (uVar4 & (UV_SIGNAL|UV_UDP)) & 1) == 0) {
            if (uVar4 != UV_UDP) goto LAB_0043e718;
            uv__udp_finish_close((uv_udp_t *)stream);
          }
          else {
            uv__stream_destroy(stream);
          }
        }
        uVar3 = stream->flags;
        if (((uVar3 & 8) != 0) && (stream->flags = uVar3 & 0xfffffff7, (uVar3 & 5) == 4)) {
          puVar2 = &stream->loop->active_handles;
          *puVar2 = *puVar2 - 1;
        }
        pvVar8 = stream->handle_queue[0];
        *(void **)stream->handle_queue[1] = pvVar8;
        *(void **)((long)pvVar8 + 8) = stream->handle_queue[1];
        if (stream->close_cb != (uv_close_cb)0x0) {
          (*stream->close_cb)((uv_handle_t *)stream);
        }
      }
      if ((int)local_38 == 1) {
        uv__update_time(loop);
        uv__run_timers(loop);
      }
      iVar9 = uv__loop_alive(loop);
      if ((0xfffffffd < mode + ~UV_RUN_NOWAIT) || (iVar9 == 0)) goto LAB_0043e6c1;
    }
    iVar9 = 1;
  }
LAB_0043e6c1:
  if (loop->stop_flag != 0) {
    loop->stop_flag = 0;
  }
  return iVar9;
}

Assistant:

int uv_run(uv_loop_t* loop, uv_run_mode mode) {
  int timeout;
  int r;
  int ran_pending;

  r = uv__loop_alive(loop);
  if (!r)
    uv__update_time(loop);

  while (r != 0 && loop->stop_flag == 0) {
    uv__update_time(loop);
    uv__run_timers(loop);
    ran_pending = uv__run_pending(loop);
    uv__run_idle(loop);
    uv__run_prepare(loop);

    timeout = 0;
    if ((mode == UV_RUN_ONCE && !ran_pending) || mode == UV_RUN_DEFAULT)
      timeout = uv_backend_timeout(loop);

    uv__io_poll(loop, timeout);
    uv__run_check(loop);
    uv__run_closing_handles(loop);

    if (mode == UV_RUN_ONCE) {
      /* UV_RUN_ONCE implies forward progress: at least one callback must have
       * been invoked when it returns. uv__io_poll() can return without doing
       * I/O (meaning: no callbacks) when its timeout expires - which means we
       * have pending timers that satisfy the forward progress constraint.
       *
       * UV_RUN_NOWAIT makes no guarantees about progress so it's omitted from
       * the check.
       */
      uv__update_time(loop);
      uv__run_timers(loop);
    }

    r = uv__loop_alive(loop);
    if (mode == UV_RUN_ONCE || mode == UV_RUN_NOWAIT)
      break;
  }

  /* The if statement lets gcc compile it to a conditional store. Avoids
   * dirtying a cache line.
   */
  if (loop->stop_flag != 0)
    loop->stop_flag = 0;

  return r;
}